

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O0

void __thiscall DBaseDecal::Remove(DBaseDecal *this)

{
  DBaseDecal *this_local;
  
  if (this->WallPrev == (DBaseDecal *)0x0) {
    if (this->Side != (side_t *)0x0) {
      this->Side->AttachedDecals = this->WallNext;
    }
  }
  else {
    this->WallPrev->WallNext = this->WallNext;
  }
  if (this->WallNext != (DBaseDecal *)0x0) {
    this->WallNext->WallPrev = this->WallPrev;
  }
  this->WallPrev = (DBaseDecal *)0x0;
  this->WallNext = (DBaseDecal *)0x0;
  return;
}

Assistant:

void DBaseDecal::Remove ()
{
	if (WallPrev == nullptr)
	{
		if (Side != nullptr) Side->AttachedDecals = WallNext;
	}
	else WallPrev->WallNext = WallNext;

	if (WallNext != nullptr) WallNext->WallPrev = WallPrev;

	WallPrev = nullptr;
	WallNext = nullptr;
}